

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal.hpp
# Opt level: O3

void tao::pegtl::normal<ovf::detail::parse::v2::keyword_value_line>::
     raise<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *param_2,ovf_segment *param_3,double **param_4)

{
  parse_error *this;
  long *plVar1;
  size_type *psVar2;
  string local_60;
  undefined1 local_40 [32];
  
  this = (parse_error *)__cxa_allocate_exception(0x28);
  internal::demangle<ovf::detail::parse::v2::keyword_value_line>();
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x1577fa);
  local_60._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar2) {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar2;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  parse_error::
  parse_error<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
            (this,&local_60,in);
  __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

static void raise( const Input& in, States&&... /*unused*/ )
         {
            throw parse_error( "parse error matching " + internal::demangle< Rule >(), in );
         }